

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

ON_ClippingPlaneData * GetClippingPlaneData(uint sn)

{
  ON_ClippingPlaneData *pOVar1;
  bool bVar2;
  bool bVar3;
  ON_ClippingPlaneData *unaff_RBX;
  long lVar4;
  
  if (sn == 0) {
    unaff_RBX = (ON_ClippingPlaneData *)0x0;
  }
  else {
    bVar3 = ON_SleepLock::GetLock(&g_data_list_lock);
    if (0 < (long)g_data_list.m_list.m_count) {
      lVar4 = 0;
      do {
        pOVar1 = g_data_list.m_list.m_a[lVar4];
        if ((pOVar1 == (ON_ClippingPlaneData *)0x0) || (pOVar1->m_sn != sn)) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
          unaff_RBX = pOVar1;
        }
        if (!bVar2) goto LAB_005746eb;
        lVar4 = lVar4 + 1;
      } while (g_data_list.m_list.m_count != lVar4);
    }
    unaff_RBX = (ON_ClippingPlaneData *)0x0;
LAB_005746eb:
    if (bVar3) {
      ON_SleepLock::ReturnLock(&g_data_list_lock);
    }
  }
  return unaff_RBX;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  bool bReturnLock = g_data_list_lock.GetLock();
  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(sn);
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}